

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O3

ion_err_t bpptree_destroy_dictionary(ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  int iVar2;
  int iVar3;
  char value_filename [12];
  char addr_filename [12];
  char acStack_28 [12];
  char local_1c [12];
  
  iVar2 = dictionary_get_filename(id,"bpt",local_1c);
  iVar3 = dictionary_get_filename(id,"val",acStack_28);
  iVar1 = '\x04';
  if ((iVar2 < 0xc) && (iVar3 < 0xc)) {
    ion_fremove(local_1c);
    ion_fremove(acStack_28);
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
bpptree_destroy_dictionary(
	ion_dictionary_id_t id
) {
	char	addr_filename[ION_MAX_FILENAME_LENGTH];
	char	value_filename[ION_MAX_FILENAME_LENGTH];

	int actual_addr_filename_length		= dictionary_get_filename(id, "bpt", addr_filename);
	int actual_value_filename_length	= dictionary_get_filename(id, "val", value_filename);

	if ((actual_addr_filename_length >= ION_MAX_FILENAME_LENGTH) || (actual_value_filename_length >= ION_MAX_FILENAME_LENGTH)) {
		return err_dictionary_destruction_error;
	}

	ion_fremove(addr_filename);
	ion_fremove(value_filename);

	return err_ok;
}